

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O0

void __thiscall
duckdb::FixedSizeAllocator::Init(FixedSizeAllocator *this,FixedSizeAllocatorInfo *info)

{
  bool bVar1;
  FixedSizeAllocator *pFVar2;
  const_reference pvVar3;
  InternalException *this_00;
  const_reference pvVar4;
  undefined8 *in_RSI;
  long in_RDI;
  unsigned_long *buffer_id_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_true> *__range1;
  value_type allocation_size;
  value_type segment_count;
  value_type buffer_block_pointer;
  value_type buffer_id;
  idx_t i;
  string *in_stack_ffffffffffffff28;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
  *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  allocator *paVar5;
  FixedSizeAllocator *this_01;
  BlockPointer *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  unsigned_long *in_stack_ffffffffffffff60;
  BlockManager *in_stack_ffffffffffffff68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  undefined8 *local_88;
  value_type local_78;
  value_type local_70;
  block_id_t local_68;
  undefined8 uStack_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  ulong local_20;
  FixedSizeAllocator *local_18;
  undefined8 *local_10;
  
  *(undefined8 *)(in_RDI + 0x10) = *in_RSI;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  local_18 = (FixedSizeAllocator *)0x0;
  local_10 = in_RSI;
  while( true ) {
    this_01 = local_18;
    pFVar2 = (FixedSizeAllocator *)
             ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 + 1));
    if (pFVar2 <= this_01) {
      local_88 = local_10 + 0xd;
      local_90._M_current =
           (unsigned_long *)
           ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff28);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff28)
      ;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffff30,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffff28);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(&local_90);
        ::std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)this_01,in_stack_ffffffffffffff38);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_90);
      }
      NextBufferWithFreeSpace(this_01);
      return;
    }
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    local_20 = *pvVar3;
    if (0x7ffffffffff080 < local_20) break;
    pvVar4 = vector<duckdb::BlockPointer,_true>::operator[]
                       ((vector<duckdb::BlockPointer,_true> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    local_68 = pvVar4->block_id;
    uStack_60._0_4_ = pvVar4->offset;
    uStack_60._4_4_ = pvVar4->unused_padding;
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    local_70 = *pvVar3;
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff30,
                        (size_type)in_stack_ffffffffffffff28);
    local_78 = *pvVar3;
    make_uniq<duckdb::FixedSizeBuffer,duckdb::BlockManager&,unsigned_long&,unsigned_long&,duckdb::BlockPointer&>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (unsigned_long *)CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff28 =
         (string *)
         ::std::
         unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
         ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
    unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
    operator=((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               *)in_stack_ffffffffffffff30,
              (unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               *)in_stack_ffffffffffffff28);
    unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 *)0x77e1a9);
    *(value_type *)(in_RDI + 0x30) = local_70 + *(long *)(in_RDI + 0x30);
    local_18 = (FixedSizeAllocator *)((long)&local_18->block_manager + 1);
  }
  local_55 = 1;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  paVar5 = &local_41;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"Initializing invalid buffer ID in FixedSizeAllocator::Init",paVar5);
  InternalException::InternalException(this_00,in_stack_ffffffffffffff28);
  local_55 = 0;
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void FixedSizeAllocator::Init(const FixedSizeAllocatorInfo &info) {
	segment_size = info.segment_size;
	total_segment_count = 0;

	for (idx_t i = 0; i < info.buffer_ids.size(); i++) {

		// read all FixedSizeBuffer data
		auto buffer_id = info.buffer_ids[i];

		// Memory safety check.
		if (buffer_id > idx_t(MAX_ROW_ID)) {
			throw InternalException("Initializing invalid buffer ID in FixedSizeAllocator::Init");
		}

		auto buffer_block_pointer = info.block_pointers[i];
		auto segment_count = info.segment_counts[i];
		auto allocation_size = info.allocation_sizes[i];

		// create the FixedSizeBuffer
		buffers[buffer_id] =
		    make_uniq<FixedSizeBuffer>(block_manager, segment_count, allocation_size, buffer_block_pointer);
		total_segment_count += segment_count;
	}

	for (const auto &buffer_id : info.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id);
	}
	NextBufferWithFreeSpace();
}